

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testValid_WithMSE(void)

{
  Rep *pRVar1;
  void *pvVar2;
  string *psVar3;
  pointer pcVar4;
  bool bVar5;
  TypeUnion TVar6;
  ModelDescription *pMVar7;
  Type *pTVar8;
  TypeUnion TVar9;
  LogMessage *other;
  MeanSquaredErrorLossLayer *pMVar10;
  FeatureType *this;
  ArrayFeatureType *this_00;
  ostream *poVar11;
  long lVar12;
  int iVar13;
  void **ppvVar14;
  long lVar15;
  NetworkUpdateParameters *pNVar16;
  Model spec;
  string targetName;
  string target;
  FeatureDescription feature;
  Result res;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  LogFinisher local_1b9;
  Model local_1b8;
  string local_188;
  long *local_168 [2];
  long local_158 [2];
  undefined1 local_148 [8];
  _Alloc_hider local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130 [2];
  _func_int **local_110;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_e8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_b8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_88;
  TensorAttributes local_58;
  TensorAttributes local_48;
  
  CoreML::Specification::Model::Model(&local_1b8);
  CoreML::Result::Result((Result *)&local_110);
  local_48.name = "InTensor";
  local_48.dimension = 3;
  local_48._12_4_ = 0;
  local_58.name = "OutTensor";
  local_58.dimension = 1;
  local_58._12_4_ = 0;
  buildBasicNeuralNetworkModel(&local_1b8,true,&local_48,&local_58,0x400,false,false);
  local_1b8.specificationversion_ = 4;
  if (local_1b8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_1b8);
    local_1b8._oneof_case_[0] = 500;
    TVar6.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar6.neuralnetwork_);
    local_1b8.Type_.pipelineclassifier_ = TVar6.pipelineclassifier_;
  }
  TVar6 = local_1b8.Type_;
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"mse_target","");
  addMeanSquareError<CoreML::Specification::NeuralNetwork>
            (&local_1b8,TVar6.neuralnetwork_,"mean_square_error","OutTensor",
             local_188._M_dataplus._M_p);
  if (local_1b8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    local_1b8.description_ = pMVar7;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&((local_1b8.description_)->traininginput_).super_RepeatedPtrFieldBase);
  pMVar7 = local_1b8.description_;
  if (local_1b8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  pRVar1 = (pMVar7->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar14 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar14 = (void **)0x0;
  }
  lVar12 = (long)(pMVar7->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar12 != 0) {
    lVar15 = 0;
    do {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)local_148,*(FeatureDescription **)((long)ppvVar14 + lVar15));
      if (local_1b8.description_ == (ModelDescription *)0x0) {
        pMVar7 = (ModelDescription *)operator_new(0x78);
        CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
        local_1b8.description_ = pMVar7;
      }
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&((local_1b8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                          (Type *)0x0);
      CoreML::Specification::FeatureDescription::CopyFrom(pTVar8,(FeatureDescription *)local_148);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)local_148);
      lVar15 = lVar15 + 8;
    } while (lVar12 * 8 != lVar15);
  }
  if (local_1b8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    local_1b8.description_ = pMVar7;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1b8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  TVar9 = local_1b8.Type_;
  if (local_1b8._oneof_case_[0] != 500) {
    TVar9.neuralnetwork_ = CoreML::Specification::NeuralNetwork::default_instance();
  }
  pNVar16 = (TVar9.neuralnetworkregressor_)->updateparams_;
  if (pNVar16 == (NetworkUpdateParameters *)0x0) {
    pNVar16 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if ((pNVar16->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_148,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_1b9,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_148);
  }
  pvVar2 = ((pNVar16->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if (*(int *)((long)pvVar2 + 0x24) == 0xb) {
    pMVar10 = *(MeanSquaredErrorLossLayer **)((long)pvVar2 + 0x18);
  }
  else {
    pMVar10 = CoreML::Specification::MeanSquaredErrorLossLayer::default_instance();
  }
  psVar3 = (pMVar10->target_).ptr_;
  pcVar4 = (psVar3->_M_dataplus)._M_p;
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_168,pcVar4,pcVar4 + psVar3->_M_string_length);
  psVar3 = (pTVar8->name_).ptr_;
  if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar8->name_,&local_188);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar3);
  }
  this = pTVar8->type_;
  if (this == (FeatureType *)0x0) {
    this = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(this);
    pTVar8->type_ = this;
  }
  if (this->_oneof_case_[0] == 5) {
    this_00 = (this->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(this);
    this->_oneof_case_[0] = 5;
    this_00 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_00);
    (this->Type_).multiarraytype_ = this_00;
  }
  this_00->datatype_ = 0x10040;
  iVar13 = (this_00->shape_).current_size_;
  if (iVar13 == (this_00->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&this_00->shape_,iVar13 + 1);
    iVar13 = (this_00->shape_).current_size_;
  }
  (this_00->shape_).current_size_ = iVar13 + 1;
  ((this_00->shape_).rep_)->elements[iVar13] = 1;
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (TVar6.neuralnetwork_,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (TVar6.neuralnetwork_,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_88);
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl._0_8_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (TVar6.neuralnetwork_,100,1,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_b8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_b8);
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl._0_8_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (TVar6.neuralnetwork_,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_e8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_e8);
  CoreML::Model::validate((Result *)local_148,&local_1b8);
  local_110 = (_func_int **)local_148;
  std::__cxx11::string::operator=((string *)&local_108,(string *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_p != local_130) {
    operator_delete(local_140._M_p,(ulong)(local_130[0]._M_allocated_capacity + 1));
  }
  bVar5 = CoreML::Result::good((Result *)&local_110);
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x966);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  if (local_168[0] != local_158) {
    operator_delete(local_168[0],local_158[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_1b8);
  return (uint)!bVar5;
}

Assistant:

int testValid_WithMSE() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    std::string targetName = "mse_target";
    addMeanSquareError(spec, neuralNet, "mean_square_error", "OutTensor", targetName.c_str());

    spec.mutable_description()->clear_traininginput();

    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    std::string target = spec.neuralnetwork().updateparams().losslayers(0).meansquarederrorlosslayer().target();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    trainingInputTensorShape->add_shape(1);

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}